

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::handleIncomplete(RunContext *this,AssertionInfo *info)

{
  AssertionResult *in_RDI;
  AssertionResult assertionResult;
  AssertionResultData data;
  AssertionInfo *in_stack_fffffffffffffeb8;
  AssertionResultData *data_00;
  AssertionInfo *in_stack_fffffffffffffed8;
  AssertionResult *in_stack_fffffffffffffee0;
  OfType in_stack_fffffffffffffeec;
  AssertionResultData *in_stack_fffffffffffffef0;
  LazyExpression local_78 [5];
  AssertionResult *in_stack_ffffffffffffffd8;
  RunContext *in_stack_ffffffffffffffe0;
  
  AssertionInfo::operator=(&in_RDI->m_info,in_stack_fffffffffffffeb8);
  LazyExpression::LazyExpression(local_78,false);
  data_00 = (AssertionResultData *)(local_78 + 1);
  AssertionResultData::AssertionResultData
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
             (LazyExpression *)in_stack_fffffffffffffee0);
  std::__cxx11::string::operator=
            ((string *)data_00,"Exception translation was disabled by CATCH_CONFIG_FAST_COMPILE");
  AssertionResult::AssertionResult(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,data_00);
  assertionEnded(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  AssertionResult::~AssertionResult(in_RDI);
  AssertionResultData::~AssertionResultData((AssertionResultData *)in_RDI);
  return;
}

Assistant:

void RunContext::handleIncomplete(
            AssertionInfo const& info
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data( ResultWas::ThrewException, LazyExpression( false ) );
        data.message = "Exception translation was disabled by CATCH_CONFIG_FAST_COMPILE";
        AssertionResult assertionResult{ info, data };
        assertionEnded( assertionResult );
    }